

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

DataAddress * __thiscall
Rml::DataExpressionInterface::ParseAddress
          (DataAddress *__return_storage_ptr__,DataExpressionInterface *this,String *address_str)

{
  char *pcVar1;
  long *plVar2;
  long lVar3;
  initializer_list<Rml::DataAddressEntry> __l;
  allocator_type local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  DataAddressEntry local_80;
  long *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if ((((address_str->_M_string_length < 4) ||
       (pcVar1 = (address_str->_M_dataplus)._M_p, *pcVar1 != 'e')) || (pcVar1[1] != 'v')) ||
     (pcVar1[2] != '.')) {
    if (this->data_model == (DataModel *)0x0) {
      (__return_storage_ptr__->
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      DataModel::ResolveAddress(__return_storage_ptr__,this->data_model,address_str,this->element);
    }
  }
  else {
    local_c0 = &local_b0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ev","");
    local_80.name._M_dataplus._M_p = (pointer)&local_80.name.field_2;
    if (local_c0 == &local_b0) {
      local_80.name.field_2._8_8_ = local_b0._8_8_;
    }
    else {
      local_80.name._M_dataplus._M_p = (pointer)local_c0;
    }
    local_80.name._M_string_length = local_b8;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_80.index = -1;
    local_c0 = &local_b0;
    ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)address_str);
    plVar2 = &local_48;
    if (local_a0 == (long *)&local_90) {
      uStack_40 = uStack_88;
      local_58 = plVar2;
    }
    else {
      local_58 = local_a0;
    }
    local_50 = local_98;
    local_98 = 0;
    local_90 = 0;
    local_38 = 0xffffffff;
    __l._M_len = 2;
    __l._M_array = &local_80;
    local_a0 = (long *)&local_90;
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
              (__return_storage_ptr__,__l,&local_c1);
    lVar3 = -0x50;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 + 1);
      }
      plVar2 = plVar2 + -5;
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0);
    if (local_a0 != (long *)&local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,
                                        local_b0._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DataAddress DataExpressionInterface::ParseAddress(const String& address_str) const
{
	if (address_str.size() >= 4 && address_str[0] == 'e' && address_str[1] == 'v' && address_str[2] == '.')
		return DataAddress{DataAddressEntry("ev"), DataAddressEntry(address_str.substr(3))};

	return data_model ? data_model->ResolveAddress(address_str, element) : DataAddress();
}